

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

uint Abc_TtCanonicizePhase(word *pTruth,int nVars)

{
  word wVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  
  uVar11 = 1 << ((byte)nVars - 6 & 0x1f);
  uVar7 = 1;
  if (6 < nVars) {
    uVar7 = uVar11;
  }
  uVar4 = 0;
  if ((long)pTruth[(long)(int)uVar7 + -1] < 0) {
    if (0 < (int)uVar7) {
      uVar5 = 0;
      do {
        pTruth[uVar5] = ~pTruth[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
    }
    uVar4 = 1 << ((byte)nVars & 0x1f);
  }
  uVar12 = nVars - 1;
  if (nVars < 7) {
    if (nVars < 1) {
      return uVar4;
    }
  }
  else {
    do {
      uVar13 = uVar12;
      iVar14 = 1 << ((char)nVars - 7U & 0x1f);
      if (1 < (int)uVar11) {
        uVar12 = uVar7 - iVar14;
        uVar8 = uVar11;
        do {
          uVar15 = uVar8 - 1;
          uVar5 = (ulong)uVar15;
          if (pTruth[(int)(uVar15 - iVar14)] != pTruth[uVar5]) {
            if (pTruth[(int)(uVar15 - iVar14)] <= pTruth[uVar5]) {
              do {
                uVar16 = (uint)uVar5;
                wVar1 = pTruth[(int)(uVar16 - iVar14)];
                pTruth[(int)(uVar16 - iVar14)] = pTruth[uVar5];
                pTruth[uVar5] = wVar1;
                uVar8 = uVar12 - iVar14;
                uVar15 = uVar8 - iVar14;
                if (uVar16 != uVar12) {
                  uVar8 = uVar16;
                  uVar15 = uVar12;
                }
                uVar12 = uVar15;
                uVar5 = (ulong)(uVar8 - 1);
              } while (1 < (int)uVar8);
              if (uVar8 != 0) {
                __assert_fail("w == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauCanon.c"
                              ,0x3ce,"int Abc_TtCanonicizePhaseVar6(word *, int, int)");
              }
              uVar4 = uVar4 ^ 1 << (uVar13 & 0x1f);
            }
            break;
          }
          uVar8 = uVar12 - iVar14;
          uVar16 = uVar8 - iVar14;
          if (uVar15 != uVar12) {
            uVar8 = uVar15;
            uVar16 = uVar12;
          }
          uVar12 = uVar16;
        } while (1 < (int)uVar8);
      }
      uVar12 = uVar13 - 1;
      nVars = uVar13;
    } while (6 < (int)uVar13);
    uVar12 = 5;
  }
  uVar5 = (ulong)uVar12;
  do {
    uVar11 = 1 << ((byte)uVar5 & 0x1f);
    uVar2 = s_Truths6[uVar5];
    uVar10 = (ulong)uVar7;
    do {
      uVar17 = uVar10;
      if ((int)uVar17 < 1) goto LAB_0049aab8;
      bVar6 = (byte)uVar11;
      uVar18 = pTruth[uVar17 - 1] << (bVar6 & 0x3f) & uVar2;
      uVar9 = pTruth[uVar17 - 1] & uVar2;
      uVar10 = uVar17 - 1;
    } while (uVar18 == uVar9);
    if (uVar18 <= uVar9) {
      uVar10 = uVar17 - 1 & 0xffffffff;
      do {
        pTruth[uVar10] =
             (pTruth[uVar10] & uVar2) >> (bVar6 & 0x3f) | pTruth[uVar10] << (bVar6 & 0x3f) & uVar2;
        uVar10 = uVar10 - 1;
        uVar12 = (int)uVar17 - 1;
        uVar17 = (ulong)uVar12;
      } while (0 < (int)uVar12);
      uVar4 = uVar4 ^ uVar11;
    }
LAB_0049aab8:
    bVar3 = (long)uVar5 < 1;
    uVar5 = uVar5 - 1;
    if (bVar3) {
      return uVar4;
    }
  } while( true );
}

Assistant:

unsigned Abc_TtCanonicizePhase( word * pTruth, int nVars )
{
    unsigned uCanonPhase = 0;
    int v, nWords = Abc_TtWordNum( nVars );
//    static int Counter = 0;
//    Counter++;

#ifdef CANON_VERIFY
    static word pCopy1[1024];
    static word pCopy2[1024];
    Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
#endif

    if ( (pTruth[nWords-1] >> 63) & 1 )
    {
        Abc_TtNot( pTruth, nWords );
        uCanonPhase ^= (1 << nVars);
    }

//    while ( 1 )
//    {
//        unsigned uCanonPhase2 = uCanonPhase;
        for ( v = nVars - 1; v >= 6; v-- )
            if ( Abc_TtCanonicizePhaseVar6( pTruth, nVars, v ) == 1 )
                uCanonPhase ^= 1 << v;
        for ( ; v >= 0; v-- )
            if ( Abc_TtCanonicizePhaseVar5( pTruth, nVars, v ) == 1 )
                uCanonPhase ^= 1 << v;
//        if ( uCanonPhase2 == uCanonPhase )
//            break;
//    }

//    for ( v = 5; v >= 0; v-- )
//        assert( Abc_TtCanonicizePhaseVar5( pTruth, nVars, v ) != 1 );

#ifdef CANON_VERIFY
    Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
    Abc_TtImplementNpnConfig( pCopy2, nVars, NULL, uCanonPhase );
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
        printf( "Canonical form verification failed!\n" );
#endif
    return uCanonPhase;
}